

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_deltaeta_chdep
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta13,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_ss_eta13_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta13,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *Cmnk_os_eta13_err)

{
  int iVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  pointer pdVar7;
  long lVar8;
  long lVar9;
  pointer pdVar10;
  pointer pdVar11;
  long lVar12;
  long lVar13;
  pointer pdVar14;
  pointer pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  allocator_type local_1e2;
  allocator_type local_1e1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_err;
  long local_1c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_os_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_3;
  value_type_conflict local_120;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_2;
  vector<double,_std::allocator<double>_> local_100;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  ulong local_68;
  long local_60;
  long local_58;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cmnk_ss_1;
  
  iVar1 = this->num_corr;
  temp_Cmnk_ss_3.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_ss_2,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_ss_3,(allocator_type *)&temp_Cmnk_ss_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_1,(long)iVar1,(value_type *)&temp_Cmnk_ss_2,
           (allocator_type *)&temp_Cmnk_os_1);
  if (temp_Cmnk_ss_2.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_2.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  temp_Cmnk_ss_4.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_ss_3,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_ss_4,(allocator_type *)&temp_Cmnk_os_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_2,(long)iVar1,(value_type *)&temp_Cmnk_ss_3,
           (allocator_type *)&temp_Cmnk_os_2);
  if (temp_Cmnk_ss_3.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_3.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  temp_Cmnk_os_1.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_ss_4,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_1,(allocator_type *)&temp_Cmnk_os_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_3,(long)iVar1,(value_type *)&temp_Cmnk_ss_4,
           (allocator_type *)&temp_Cmnk_os_3);
  if (temp_Cmnk_ss_4.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_4.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  temp_Cmnk_os_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_1,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_2,(allocator_type *)&temp_Cmnk_os_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_ss_4,(long)iVar1,(value_type *)&temp_Cmnk_os_1,
           (allocator_type *)&temp_Cmnk_os_4);
  if (temp_Cmnk_os_1.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_1.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  temp_Cmnk_os_3.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_2,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_3,(allocator_type *)&temp_Cmnk_os_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_1,(long)iVar1,(value_type *)&temp_Cmnk_os_2,
           (allocator_type *)&temp_Cmnk_err);
  if (temp_Cmnk_os_2.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_2.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  temp_Cmnk_os_4.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_3,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_os_4,(allocator_type *)&temp_Cmnk_err);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_2,(long)iVar1,(value_type *)&temp_Cmnk_os_3,(allocator_type *)&local_100);
  if (temp_Cmnk_os_3.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_3.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  temp_Cmnk_err.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_os_4,(long)this->N_rap,
             (value_type_conflict *)&temp_Cmnk_err,(allocator_type *)&local_100);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_3,(long)iVar1,(value_type *)&temp_Cmnk_os_4,(allocator_type *)&local_120);
  if (temp_Cmnk_os_4.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_4.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cmnk_err,(long)this->N_rap,
             (value_type_conflict *)&local_100,(allocator_type *)&local_120);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_os_4,(long)iVar1,(value_type *)&temp_Cmnk_err,&local_1e2);
  if (temp_Cmnk_err.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_err.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->num_corr;
  local_120 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_100,(long)this->N_rap,&local_120,(allocator_type *)&local_1e2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cmnk_err,(long)iVar1,&local_100,&local_1e1);
  if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,2,&temp_Cmnk_os_1,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,2,&temp_Cmnk_os_2,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,2,&temp_Cmnk_os_3,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,2,&temp_Cmnk_os_4,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,1,&temp_Cmnk_ss_1,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,1,1,&temp_Cmnk_ss_2,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,1,&temp_Cmnk_ss_3,&temp_Cmnk_err);
  calculate_three_particle_correlation_deltaeta
            (this,event_Qn_m_rap_real,event_Qn_m_rap_imag,event_Qn_m_rap_real,event_Qn_m_rap_imag,
             event_Qn_rap_real,event_Qn_rap_imag,2,1,&temp_Cmnk_ss_4,&temp_Cmnk_err);
  local_60 = (long)this->num_corr;
  if (0 < local_60) {
    uVar2 = this->N_rap;
    local_68 = (ulong)uVar2;
    local_70 = temp_Cmnk_ss_1.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_78 = temp_Cmnk_ss_2.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (Cmnk_ss_eta12->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_88 = (Cmnk_ss_eta12_err->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_90 = temp_Cmnk_ss_3.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_98 = temp_Cmnk_ss_4.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (Cmnk_ss_eta13->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_a8 = (Cmnk_ss_eta13_err->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_b0 = temp_Cmnk_os_1.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_b8 = (Cmnk_os_eta12->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_c0 = (Cmnk_os_eta12_err->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_c8 = (Cmnk_os_eta13->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_d0 = (Cmnk_os_eta13_err->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_58 = local_68 << 3;
    local_d8 = temp_Cmnk_os_2.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_e0 = temp_Cmnk_os_3.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_e8 = temp_Cmnk_os_4.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_1c8 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = temp_Cmnk_ss_1.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar4 = temp_Cmnk_ss_2.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar5 = *(long *)&local_80[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data;
        lVar6 = *(long *)&local_88[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data;
        local_50 = temp_Cmnk_ss_3.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pdVar7 = temp_Cmnk_ss_4.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar8 = *(long *)&local_a0[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data;
        lVar9 = *(long *)&local_a8[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data;
        pdVar10 = temp_Cmnk_os_1.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = temp_Cmnk_os_2.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar12 = *(long *)&local_b8[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar13 = *(long *)&local_c0[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        pdVar14 = temp_Cmnk_os_3.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar15 = temp_Cmnk_os_4.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar16 = *(long *)&local_c8[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar17 = *(long *)&local_d0[local_1c8].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar18 = 0;
        do {
          dVar19 = *(double *)((long)pdVar3 + lVar18) + *(double *)((long)pdVar4 + lVar18);
          *(double *)(lVar5 + lVar18) = *(double *)(lVar5 + lVar18) + dVar19;
          *(double *)(lVar6 + lVar18) = dVar19 * dVar19 + *(double *)(lVar6 + lVar18);
          dVar19 = *(double *)((long)local_50 + lVar18) + *(double *)((long)pdVar7 + lVar18);
          *(double *)(lVar8 + lVar18) = *(double *)(lVar8 + lVar18) + dVar19;
          *(double *)(lVar9 + lVar18) = dVar19 * dVar19 + *(double *)(lVar9 + lVar18);
          dVar19 = *(double *)((long)pdVar10 + lVar18) + *(double *)((long)pdVar11 + lVar18);
          *(double *)(lVar12 + lVar18) = *(double *)(lVar12 + lVar18) + dVar19;
          *(double *)(lVar13 + lVar18) = dVar19 * dVar19 + *(double *)(lVar13 + lVar18);
          dVar19 = *(double *)((long)pdVar14 + lVar18) + *(double *)((long)pdVar15 + lVar18);
          *(double *)(lVar16 + lVar18) = *(double *)(lVar16 + lVar18) + dVar19;
          *(double *)(lVar17 + lVar18) = dVar19 * dVar19 + *(double *)(lVar17 + lVar18);
          lVar18 = lVar18 + 8;
        } while (local_58 != lVar18);
      }
      local_1c8 = local_1c8 + 1;
    } while (local_1c8 != local_60);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_err);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_os_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cmnk_ss_1);
  return;
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_deltaeta_chdep(
    vector<vector<double>> &event_Qn_p_rap_real,
    vector<vector<double>> &event_Qn_p_rap_imag,
    vector<vector<double>> &event_Qn_m_rap_real,
    vector<vector<double>> &event_Qn_m_rap_imag,
    vector<vector<double>> &event_Qn_rap_real,
    vector<vector<double>> &event_Qn_rap_imag,
    vector<vector<double>> &Cmnk_ss_eta12,
    vector<vector<double>> &Cmnk_ss_eta12_err,
    vector<vector<double>> &Cmnk_os_eta12,
    vector<vector<double>> &Cmnk_os_eta12_err,
    vector<vector<double>> &Cmnk_ss_eta13,
    vector<vector<double>> &Cmnk_ss_eta13_err,
    vector<vector<double>> &Cmnk_os_eta13,
    vector<vector<double>> &Cmnk_os_eta13_err) {
    vector<vector<double>> temp_Cmnk_ss_1(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_2(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_3(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_ss_4(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_1(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_2(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_3(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_os_4(num_corr, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cmnk_err(num_corr, vector<double>(N_rap, 0.));

    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 2,
        temp_Cmnk_os_1, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 2,
        temp_Cmnk_os_2, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 2,
        temp_Cmnk_os_3, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 2,
        temp_Cmnk_os_4, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 1,
        temp_Cmnk_ss_1, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 1, 1,
        temp_Cmnk_ss_2, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 1,
        temp_Cmnk_ss_3, temp_Cmnk_err);
    calculate_three_particle_correlation_deltaeta(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, event_Qn_rap_real, event_Qn_rap_imag, 2, 1,
        temp_Cmnk_ss_4, temp_Cmnk_err);

    for (int i = 0; i < num_corr; i++) {
        for (int j = 0; j < N_rap; j++) {
            double temp_ss_12 = temp_Cmnk_ss_1[i][j] + temp_Cmnk_ss_2[i][j];
            Cmnk_ss_eta12[i][j] += temp_ss_12;
            Cmnk_ss_eta12_err[i][j] += temp_ss_12 * temp_ss_12;
            double temp_ss_13 = temp_Cmnk_ss_3[i][j] + temp_Cmnk_ss_4[i][j];
            Cmnk_ss_eta13[i][j] += temp_ss_13;
            Cmnk_ss_eta13_err[i][j] += temp_ss_13 * temp_ss_13;
            double temp_os_12 = temp_Cmnk_os_1[i][j] + temp_Cmnk_os_2[i][j];
            Cmnk_os_eta12[i][j] += temp_os_12;
            Cmnk_os_eta12_err[i][j] += temp_os_12 * temp_os_12;
            double temp_os_13 = temp_Cmnk_os_3[i][j] + temp_Cmnk_os_4[i][j];
            Cmnk_os_eta13[i][j] += temp_os_13;
            Cmnk_os_eta13_err[i][j] += temp_os_13 * temp_os_13;
        }
    }
}